

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

bool kratos::GeneratorPortVisitor::correct_src_type(Var *src,Generator *generator)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VarType VVar3;
  bool bVar4;
  undefined1 local_30 [8];
  shared_ptr<kratos::VarCasted> casted;
  
  VVar3 = src->type_;
  if (VVar3 == BaseCasted) {
    Var::as<kratos::VarCasted>((Var *)local_30);
    src = *(Var **)((long)local_30 + 0x278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&casted);
    VVar3 = src->type_;
  }
  bVar4 = true;
  switch(VVar3) {
  case Base:
  case ConstValue:
  case Parameter:
    break;
  default:
    bVar4 = false;
    break;
  case PortIO:
    iVar1 = (*(src->super_IRNode)._vptr_IRNode[4])(src);
    iVar2 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
    bVar4 = CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2);
  }
  return bVar4;
}

Assistant:

static inline bool correct_src_type(Var* src, Generator* generator) {
        if (src->type() == VarType::BaseCasted) {
            auto casted = src->as<VarCasted>();
            src = casted->parent_var();
        }
        return src->type() == VarType::Base || src->type() == VarType::ConstValue ||
               src->type() == VarType::Parameter ||
               (src->type() == VarType::PortIO && src->parent() == generator->parent());
    }